

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgemm.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_4bce2::tinyBLAS_Q0_AVX<block_q5_0,_block_q8_0,_float>::mnpack
          (tinyBLAS_Q0_AVX<block_q5_0,_block_q8_0,_float> *this,int64_t m0,int64_t m,int64_t n0,
          int64_t n)

{
  long in_RCX;
  long in_RDX;
  tinyBLAS_Q0_AVX<block_q5_0,_block_q8_0,_float> *in_RSI;
  long in_R8;
  int64_t np;
  int64_t mp;
  int64_t nc;
  int64_t mc;
  int64_t in_stack_000000c8;
  int64_t in_stack_000000d0;
  int64_t in_stack_000000d8;
  int64_t in_stack_000000e0;
  tinyBLAS_Q0_AVX<block_q5_0,_block_q8_0,_float> *in_stack_000000e8;
  int64_t in_stack_000000f0;
  int64_t in_stack_000000f8;
  int64_t in_stack_00000100;
  tinyBLAS_Q0_AVX<block_q5_0,_block_q8_0,_float> *in_stack_00000108;
  int64_t in_stack_00000110;
  int64_t in_stack_00000118;
  int64_t in_stack_00000120;
  tinyBLAS_Q0_AVX<block_q5_0,_block_q8_0,_float> *in_stack_00000128;
  int64_t in_stack_00000130;
  int64_t in_stack_00000138;
  int64_t in_stack_00000140;
  tinyBLAS_Q0_AVX<block_q5_0,_block_q8_0,_float> *in_stack_00000148;
  int64_t in_stack_00000168;
  int64_t in_stack_00000170;
  int64_t in_stack_00000178;
  int64_t in_stack_00000180;
  tinyBLAS_Q0_AVX<block_q5_0,_block_q8_0,_float> *in_stack_00000188;
  int64_t in_stack_000001c8;
  int64_t in_stack_000001d0;
  int64_t in_stack_000001d8;
  int64_t in_stack_000001e0;
  tinyBLAS_Q0_AVX<block_q5_0,_block_q8_0,_float> *in_stack_000001e8;
  int64_t in_stack_00000268;
  int64_t in_stack_00000270;
  int64_t in_stack_00000278;
  int64_t in_stack_00000280;
  tinyBLAS_Q0_AVX<block_q5_0,_block_q8_0,_float> *in_stack_00000288;
  int64_t in_stack_000002e8;
  int64_t in_stack_000002f0;
  int64_t in_stack_000002f8;
  int64_t in_stack_00000300;
  tinyBLAS_Q0_AVX<block_q5_0,_block_q8_0,_float> *in_stack_00000308;
  int64_t in_stack_00000368;
  int64_t in_stack_00000370;
  int64_t in_stack_00000378;
  int64_t in_stack_00000380;
  tinyBLAS_Q0_AVX<block_q5_0,_block_q8_0,_float> *in_stack_00000388;
  int64_t in_stack_000003e8;
  int64_t in_stack_000003f0;
  int64_t in_stack_000003f8;
  int64_t in_stack_00000400;
  tinyBLAS_Q0_AVX<block_q5_0,_block_q8_0,_float> *in_stack_00000408;
  int64_t in_stack_00000468;
  int64_t in_stack_00000470;
  int64_t in_stack_00000478;
  int64_t in_stack_00000480;
  tinyBLAS_Q0_AVX<block_q5_0,_block_q8_0,_float> *in_stack_00000488;
  ulong local_68;
  long local_58;
  int64_t n_00;
  
  if (in_RDX - (long)in_RSI < 4) {
    local_58 = in_RDX - (long)in_RSI;
  }
  else {
    local_58 = 4;
  }
  if (in_R8 - in_RCX < 4) {
    local_68 = in_R8 - in_RCX;
  }
  else {
    local_68 = 4;
  }
  switch(local_58 << 4 | local_68) {
  case 0x11:
    n_00 = 1;
    (anonymous_namespace)::tinyBLAS_Q0_AVX<block_q5_0,block_q8_0,float>::gemm<1,1>
              (in_stack_000000e8,in_stack_000000e0,in_stack_000000d8,in_stack_000000d0,
               in_stack_000000c8);
    break;
  case 0x12:
    n_00 = 1;
    (anonymous_namespace)::tinyBLAS_Q0_AVX<block_q5_0,block_q8_0,float>::gemm<1,2>
              (in_stack_00000108,in_stack_00000100,in_stack_000000f8,in_stack_000000f0,
               (int64_t)in_stack_000000e8);
    break;
  case 0x13:
    n_00 = 1;
    (anonymous_namespace)::tinyBLAS_Q0_AVX<block_q5_0,block_q8_0,float>::gemm<1,3>
              (in_stack_00000128,in_stack_00000120,in_stack_00000118,in_stack_00000110,
               (int64_t)in_stack_00000108);
    break;
  case 0x14:
    n_00 = 1;
    gemmMx4<1>(in_stack_00000388,in_stack_00000380,in_stack_00000378,in_stack_00000370,
               in_stack_00000368);
    break;
  default:
    return;
  case 0x21:
    n_00 = 2;
    (anonymous_namespace)::tinyBLAS_Q0_AVX<block_q5_0,block_q8_0,float>::gemm<2,1>
              (in_stack_00000108,in_stack_00000100,in_stack_000000f8,in_stack_000000f0,
               (int64_t)in_stack_000000e8);
    break;
  case 0x22:
    n_00 = 2;
    (anonymous_namespace)::tinyBLAS_Q0_AVX<block_q5_0,block_q8_0,float>::gemm<2,2>
              (in_stack_00000148,in_stack_00000140,in_stack_00000138,in_stack_00000130,
               (int64_t)in_stack_00000128);
    break;
  case 0x23:
    n_00 = 2;
    (anonymous_namespace)::tinyBLAS_Q0_AVX<block_q5_0,block_q8_0,float>::gemm<2,3>
              (in_stack_00000188,in_stack_00000180,in_stack_00000178,in_stack_00000170,
               in_stack_00000168);
    break;
  case 0x24:
    n_00 = 2;
    gemmMx4<2>(in_stack_00000408,in_stack_00000400,in_stack_000003f8,in_stack_000003f0,
               in_stack_000003e8);
    break;
  case 0x31:
    n_00 = 3;
    (anonymous_namespace)::tinyBLAS_Q0_AVX<block_q5_0,block_q8_0,float>::gemm<3,1>
              (in_stack_00000128,in_stack_00000120,in_stack_00000118,in_stack_00000110,
               (int64_t)in_stack_00000108);
    break;
  case 0x32:
    n_00 = 3;
    (anonymous_namespace)::tinyBLAS_Q0_AVX<block_q5_0,block_q8_0,float>::gemm<3,2>
              (in_stack_00000188,in_stack_00000180,in_stack_00000178,in_stack_00000170,
               in_stack_00000168);
    break;
  case 0x33:
    n_00 = 3;
    (anonymous_namespace)::tinyBLAS_Q0_AVX<block_q5_0,block_q8_0,float>::gemm<3,3>
              (in_stack_000001e8,in_stack_000001e0,in_stack_000001d8,in_stack_000001d0,
               in_stack_000001c8);
    break;
  case 0x34:
    n_00 = 3;
    gemmMx4<3>(in_stack_00000488,in_stack_00000480,in_stack_00000478,in_stack_00000470,
               in_stack_00000468);
    break;
  case 0x41:
    n_00 = 4;
    gemm4xN<1>(in_stack_00000288,in_stack_00000280,in_stack_00000278,in_stack_00000270,
               in_stack_00000268);
    break;
  case 0x42:
    n_00 = 4;
    gemm4xN<2>(in_stack_00000308,in_stack_00000300,in_stack_000002f8,in_stack_000002f0,
               in_stack_000002e8);
    break;
  case 0x43:
    n_00 = 4;
    gemm4xN<3>(in_stack_00000388,in_stack_00000380,in_stack_00000378,in_stack_00000370,
               in_stack_00000368);
    break;
  case 0x44:
    n_00 = 4;
    gemm4xN<4>(in_stack_00000408,in_stack_00000400,in_stack_000003f8,in_stack_000003f0,
               in_stack_000003e8);
  }
  mnpack(in_RSI,in_RDX,in_RCX,in_R8,n_00);
  mnpack(in_RSI,in_RDX,in_RCX,in_R8,n_00);
  return;
}

Assistant:

void mnpack(int64_t m0, int64_t m, int64_t n0, int64_t n) {
        int64_t mc, nc, mp, np;
        switch ((MIN(m - m0, 4) << 4) | MIN(n - n0, 4)) {
#if VECTOR_REGISTERS == 32
        case 0x44:
            mc = 4;
            nc = 4;
#if defined(__AVX2__) && defined(__F16C__)
            gemm4xN<4>(m0, m, n0, n);
#else
            gemm<4, 4>(m0, m, n0, n);
#endif
            break;
        case 0x43:
            mc = 4;
            nc = 3;
#if defined(__AVX2__) && defined(__F16C__)
            gemm4xN<3>(m0, m, n0, n);
#else
            gemm<4, 3>(m0, m, n0, n);
#endif
            break;
        case 0x34:
            mc = 3;
            nc = 4;
#if defined(__AVX2__) && defined(__F16C__)
            gemmMx4<3>(m0, m, n0, n);
#else
            gemm<3, 4>(m0, m, n0, n);
#endif
            break;
        case 0x33:
            mc = 3;
            nc = 3;
            gemm<3, 3>(m0, m, n0, n);
            break;
        case 0x42:
            mc = 4;
            nc = 2;
#if defined(__AVX2__) && defined(__F16C__)
            gemm4xN<2>(m0, m, n0, n);
#else
            gemm<4, 2>(m0, m, n0, n);
#endif
            break;
        case 0x24:
            mc = 2;
            nc = 4;
#if defined(__AVX2__) && defined(__F16C__)
            gemmMx4<2>(m0, m, n0, n);
#else
            gemm<2, 4>(m0, m, n0, n);
#endif
            break;
#else
        case 0x44:
        case 0x43:
        case 0x42:
            mc = 4;
            nc = 2;
#if defined(__AVX2__) && defined(__F16C__)
            gemm4xN<2>(m0, m, n0, n);
#else
            gemm<4, 2>(m0, m, n0, n);
#endif
            break;
        case 0x34:
        case 0x24:
            mc = 2;
            nc = 4;
#if defined(__AVX2__) && defined(__F16C__)
            gemmMx4<2>(m0, m, n0, n);
#else
            gemm<2, 4>(m0, m, n0, n);
#endif
            break;
        case 0x33:
#endif
        case 0x32:
            mc = 3;
            nc = 2;
            gemm<3, 2>(m0, m, n0, n);
            break;
        case 0x23:
            mc = 2;
            nc = 3;
            gemm<2, 3>(m0, m, n0, n);
            break;
        case 0x41:
            mc = 4;
            nc = 1;
#if defined(__AVX2__) && defined(__F16C__)
            gemm4xN<1>(m0, m, n0, n);
#else
            gemm<4, 1>(m0, m, n0, n);
#endif
            break;
        case 0x22:
            mc = 2;
            nc = 2;
            gemm<2, 2>(m0, m, n0, n);
            break;
        case 0x14:
            mc = 1;
            nc = 4;
#if defined(__AVX2__) && defined(__F16C__)
            gemmMx4<1>(m0, m, n0, n);
#else
            gemm<1, 4>(m0, m, n0, n);
#endif
            break;
        case 0x31:
            mc = 3;
            nc = 1;
            gemm<3, 1>(m0, m, n0, n);
            break;
        case 0x13:
            mc = 1;
            nc = 3;
            gemm<1, 3>(m0, m, n0, n);
            break;
        case 0x21:
            mc = 2;
            nc = 1;
            gemm<2, 1>(m0, m, n0, n);
            break;
        case 0x12:
            mc = 1;
            nc = 2;
            gemm<1, 2>(m0, m, n0, n);
            break;
        case 0x11:
            mc = 1;
            nc = 1;
            gemm<1, 1>(m0, m, n0, n);
            break;
        default:
            return;
        }
        mp = m0 + (m - m0) / mc * mc;
        np = n0 + (n - n0) / nc * nc;
        mnpack(mp, m, n0, np);
        mnpack(m0, m, np, n);
    }